

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall
CTcEmbedBuilderDbl::add_embedding(CTcEmbedBuilderDbl *this,CTcPrsNode *cur,CTcPrsNode *sub)

{
  CTPNDstrEmbed *this_00;
  CTPNDstrEmbed *pCVar1;
  
  this_00 = (CTPNDstrEmbed *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x10,(size_t)cur);
  CTPNDstrEmbed::CTPNDstrEmbed(this_00,sub);
  pCVar1 = this_00;
  if (cur != (CTcPrsNode *)0x0) {
    pCVar1 = (CTPNDstrEmbed *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x18,(size_t)sub);
    (pCVar1->super_CTPNDstrEmbedBase).super_CTPNUnary.super_CTPNUnaryBase.sub_ = cur;
    pCVar1[1].super_CTPNDstrEmbedBase.super_CTPNUnary.super_CTPNUnaryBase.super_CTcPrsNode.
    super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)this_00;
    (pCVar1->super_CTPNDstrEmbedBase).super_CTPNUnary.super_CTPNUnaryBase.super_CTcPrsNode.
    super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00351300;
  }
  return (CTcPrsNode *)pCVar1;
}

Assistant:

virtual CTcPrsNode *add_embedding(CTcPrsNode *cur, CTcPrsNode *sub)
    {
        /* wrap the expresion in a "say()" embedding node */
        sub = new CTPNDstrEmbed(sub);
        
        /*
         *   Build a node representing everything so far: do this by
         *   combining the sub-expression with everything preceding, using a
         *   comma operator.  This isn't necessary if there's nothing
         *   preceding the sub-expression, since this means the
         *   sub-expression itself is everything so far.  
         */
        if (cur != 0)
            return new CTPNComma(cur, sub);
        else
            return sub;
    }